

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void google::protobuf::compiler::js::anon_unknown_0::DepthFirstSearch
               (FileDescriptor *file,
               vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
               *list,set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     *seen)

{
  int iVar1;
  _Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*> __x;
  byte bVar2;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *in_RDX;
  FileDescriptor *in_RSI;
  FileDescriptor *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_google::protobuf::FileDescriptor_*>,_bool> pVar3;
  int i;
  int local_3c;
  undefined7 in_stack_ffffffffffffffd1;
  value_type *in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe0;
  byte bVar4;
  undefined7 in_stack_ffffffffffffffe1;
  
  pVar3 = std::
          set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          ::insert((set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffd8);
  __x = pVar3.first._M_node;
  bVar2 = pVar3.second;
  if (((bVar2 ^ 0xff) & 1) == 0) {
    bVar4 = bVar2;
    for (local_3c = 0; iVar1 = FileDescriptor::dependency_count(in_RDI), local_3c < iVar1;
        local_3c = local_3c + 1) {
      FileDescriptor::dependency
                ((FileDescriptor *)CONCAT71(in_stack_ffffffffffffffd1,bVar2),
                 (int)((ulong)__x._M_node >> 0x20));
      DepthFirstSearch(in_RSI,in_RDX,
                       (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        *)CONCAT71(in_stack_ffffffffffffffe1,bVar4));
    }
    std::
    vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 *)CONCAT71(in_stack_ffffffffffffffd1,bVar2),(value_type *)__x._M_node);
  }
  return;
}

Assistant:

void DepthFirstSearch(const FileDescriptor* file,
                      std::vector<const FileDescriptor*>* list,
                      std::set<const FileDescriptor*>* seen) {
  if (!seen->insert(file).second) {
    return;
  }

  // Add all dependencies.
  for (int i = 0; i < file->dependency_count(); i++) {
    DepthFirstSearch(file->dependency(i), list, seen);
  }

  // Add this file.
  list->push_back(file);
}